

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_fma_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  float *pfVar18;
  int iVar19;
  float *pfVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float in_register_0000131c;
  
  uVar1 = a->c;
  iVar16 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar19 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    uVar21 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar21 = 0;
    }
    for (uVar15 = 0; uVar15 != uVar21; uVar15 = uVar15 + 1) {
      pvVar2 = a->data;
      sVar3 = a->elemsize;
      sVar4 = a->cstep;
      pfVar20 = (float *)(sVar4 * uVar15 * sVar3 + (long)pvVar2);
      pvVar5 = c->data;
      sVar6 = c->elemsize;
      sVar7 = c->cstep;
      pfVar18 = (float *)(sVar7 * uVar15 * sVar6 + (long)pvVar5);
      fVar22 = 1.0 / *b->data;
      auVar8 = vshufps_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22),0);
      lVar17 = 0;
      iVar19 = 0;
      while( true ) {
        fVar23 = auVar8._0_4_;
        fVar24 = auVar8._4_4_;
        fVar25 = auVar8._8_4_;
        if (iVar16 <= iVar19 + 7) break;
        fVar9 = pfVar20[1];
        fVar10 = pfVar20[2];
        fVar11 = pfVar20[3];
        fVar12 = pfVar20[4];
        fVar13 = pfVar20[5];
        fVar14 = pfVar20[6];
        *pfVar18 = fVar23 * *pfVar20;
        pfVar18[1] = fVar24 * fVar9;
        pfVar18[2] = fVar25 * fVar10;
        pfVar18[3] = auVar8._12_4_ * fVar11;
        pfVar18[4] = fVar23 * fVar12;
        pfVar18[5] = fVar24 * fVar13;
        pfVar18[6] = fVar25 * fVar14;
        pfVar18[7] = in_register_0000131c;
        pfVar20 = pfVar20 + 8;
        pfVar18 = pfVar18 + 8;
        iVar19 = iVar19 + 8;
        lVar17 = lVar17 + 8;
      }
      for (; iVar19 + 3 < iVar16; iVar19 = iVar19 + 4) {
        fVar9 = pfVar20[1];
        fVar10 = pfVar20[2];
        fVar11 = pfVar20[3];
        *pfVar18 = fVar23 * *pfVar20;
        pfVar18[1] = fVar24 * fVar9;
        pfVar18[2] = fVar25 * fVar10;
        pfVar18[3] = auVar8._12_4_ * fVar11;
        pfVar20 = pfVar20 + 4;
        pfVar18 = pfVar18 + 4;
        lVar17 = lVar17 + 4;
      }
      for (; (int)lVar17 < iVar16; lVar17 = lVar17 + 1) {
        *(float *)((long)pvVar5 + lVar17 * 4 + sVar7 * sVar6 * uVar15) =
             fVar22 * *(float *)((long)pvVar2 + lVar17 * 4 + sVar4 * sVar3 * uVar15);
      }
    }
    iVar19 = 0;
  }
  return iVar19;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}